

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_loop.c
# Opt level: O3

void loop_undo(jit_State *J,IRRef ins,SnapNo nsnap,MSize nsnapmap)

{
  long lVar1;
  byte *pbVar2;
  ushort uVar3;
  uint uVar4;
  SnapShot *pSVar5;
  SnapEntry *pSVar6;
  IRIns *pIVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [16];
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pSVar5 = (J->cur).snap;
  pSVar6 = (J->cur).snapmap;
  pSVar6[(ulong)pSVar5[nsnap - 1].mapofs + (ulong)pSVar5[nsnap - 1].nent] = pSVar6[pSVar5->nent];
  (J->cur).nsnapmap = (uint16_t)nsnapmap;
  (J->cur).nsnap = (uint16_t)nsnap;
  (J->guardemit).irt = '\0';
  uVar4 = (J->cur).nins;
  uVar13 = (ulong)uVar4;
  if (ins < uVar4) {
    pIVar7 = (J->cur).ir;
    do {
      lVar14 = uVar13 * 8;
      lVar1 = uVar13 * 8;
      uVar13 = uVar13 - 1;
      J->chain[*(byte *)((long)pIVar7 + lVar1 + -3)] = *(IRRef1 *)((long)pIVar7 + lVar14 + -2);
    } while (ins < uVar13);
  }
  (J->cur).nins = (IRRef)uVar13;
  auVar12 = _DAT_00155f00;
  auVar15._4_4_ = ins;
  auVar15._0_4_ = ins;
  auVar15._8_4_ = ins;
  auVar15._12_4_ = ins;
  lVar14 = 0;
  auVar15 = auVar15 ^ _DAT_00155f00;
  do {
    uVar3 = J->bpropcache[lVar14 + 3].val;
    auVar8._12_2_ = uVar3;
    auVar8._0_12_ = ZEXT212(uVar3) << 0x30;
    auVar10._6_8_ = 0;
    auVar10._0_6_ =
         (uint6)(CONCAT44(auVar8._10_4_,CONCAT22(J->bpropcache[lVar14 + 2].val,uVar3)) >> 0x10);
    auVar18._6_8_ = SUB148(auVar10 << 0x40,6);
    auVar18._4_2_ = J->bpropcache[lVar14 + 1].val;
    auVar18._2_2_ = 0;
    auVar18._0_2_ = J->bpropcache[lVar14].val;
    auVar18._14_2_ = 0;
    auVar18 = auVar18 | auVar12;
    auVar17._0_4_ = -(uint)(auVar18._0_4_ < auVar15._0_4_);
    auVar17._4_4_ = -(uint)(auVar18._4_4_ < auVar15._4_4_);
    auVar17._8_4_ = -(uint)(auVar18._8_4_ < auVar15._8_4_);
    auVar17._12_4_ = -(uint)(auVar18._12_4_ < auVar15._12_4_);
    if ((~auVar17._0_4_ & 1) != 0) {
      J->bpropcache[lVar14].key = 0;
    }
    auVar18 = pshuflw(auVar18,auVar17,0xaa);
    if ((~auVar18._0_4_ >> 0x10 & 1) != 0) {
      J->bpropcache[lVar14 + 1].key = 0;
    }
    if ((((ushort)auVar17._8_4_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar14 + 2].key = 0;
    }
    if ((((ushort)auVar17._12_4_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar14 + 3].key = 0;
    }
    uVar3 = J->bpropcache[lVar14 + 7].val;
    auVar9._12_2_ = uVar3;
    auVar9._0_12_ = ZEXT212(uVar3) << 0x30;
    auVar11._6_8_ = 0;
    auVar11._0_6_ =
         (uint6)(CONCAT44(auVar9._10_4_,CONCAT22(J->bpropcache[lVar14 + 6].val,uVar3)) >> 0x10);
    auVar19._6_8_ = SUB148(auVar11 << 0x40,6);
    auVar19._4_2_ = J->bpropcache[lVar14 + 5].val;
    auVar19._2_2_ = 0;
    auVar19._0_2_ = J->bpropcache[lVar14 + 4].val;
    auVar19._14_2_ = 0;
    auVar19 = auVar19 | auVar12;
    auVar16._0_4_ = -(uint)(auVar19._0_4_ < auVar15._0_4_);
    auVar16._4_4_ = -(uint)(auVar19._4_4_ < auVar15._4_4_);
    auVar16._8_4_ = -(uint)(auVar19._8_4_ < auVar15._8_4_);
    auVar16._12_4_ = -(uint)(auVar19._12_4_ < auVar15._12_4_);
    if ((((ushort)auVar16._0_4_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar14 + 4].key = 0;
    }
    if ((((ushort)auVar16._4_4_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar14 + 5].key = 0;
    }
    if ((((ushort)auVar16._8_4_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar14 + 6].key = 0;
    }
    auVar17 = pshufhw(auVar16,auVar16,0xaa);
    if (((auVar17._14_2_ ^ 0xffff) & 1) != 0) {
      J->bpropcache[lVar14 + 7].key = 0;
    }
    lVar14 = lVar14 + 8;
  } while (lVar14 != 0x10);
  if (0x8000 < ins - 1) {
    uVar13 = (ulong)(ins - 1);
    do {
      pbVar2 = (byte *)((long)(J->cur).ir + uVar13 * 8 + 4);
      *pbVar2 = *pbVar2 & 0x9f;
      uVar13 = uVar13 - 1;
    } while (0x8000 < (uint)uVar13);
  }
  return;
}

Assistant:

static void loop_undo(jit_State *J, IRRef ins, SnapNo nsnap, MSize nsnapmap)
{
  ptrdiff_t i;
  SnapShot *snap = &J->cur.snap[nsnap-1];
  SnapEntry *map = J->cur.snapmap;
  map[snap->mapofs + snap->nent] = map[J->cur.snap[0].nent];  /* Restore PC. */
  J->cur.nsnapmap = (uint16_t)nsnapmap;
  J->cur.nsnap = nsnap;
  J->guardemit.irt = 0;
  lj_ir_rollback(J, ins);
  for (i = 0; i < BPROP_SLOTS; i++) {  /* Remove backprop. cache entries. */
    BPropEntry *bp = &J->bpropcache[i];
    if (bp->val >= ins)
      bp->key = 0;
  }
  for (ins--; ins >= REF_FIRST; ins--) {  /* Remove flags. */
    IRIns *ir = IR(ins);
    irt_clearphi(ir->t);
    irt_clearmark(ir->t);
  }
}